

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::IObject>::DoublePtrHelper<Diligent::IObject>::~DoublePtrHelper
          (DoublePtrHelper<Diligent::IObject> *this)

{
  IObject *pIVar1;
  DoublePtrHelper<Diligent::IObject> *this_local;
  
  if (this->m_pAutoPtr != (RefCntAutoPtr<Diligent::IObject> *)0x0) {
    pIVar1 = Diligent::RefCntAutoPtr::operator_cast_to_IObject_((RefCntAutoPtr *)this->m_pAutoPtr);
    if (pIVar1 != this->NewRawPtr) {
      RefCntAutoPtr<Diligent::IObject>::Attach(this->m_pAutoPtr,this->NewRawPtr);
    }
  }
  return;
}

Assistant:

~DoublePtrHelper()
        {
            if (m_pAutoPtr && *m_pAutoPtr != static_cast<T*>(NewRawPtr))
            {
                m_pAutoPtr->Attach(static_cast<T*>(NewRawPtr));
            }
        }